

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall tinyxml2::XMLElement::ParseAttributes(XMLElement *this,char *p,int *curLineNumPtr)

{
  MemPool *pMVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *p_00;
  XMLAttribute *this_00;
  char *pcVar5;
  char *pcVar6;
  XMLAttribute *pXVar7;
  XMLAttribute **ppXVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLError error;
  XMLDocument *pXVar9;
  XMLAttribute *pXVar10;
  
  if (p != (char *)0x0) {
    p_00 = (byte *)XMLUtil::SkipWhiteSpace(p,curLineNumPtr);
    bVar2 = *p_00;
    if (bVar2 != 0) {
      pXVar10 = (XMLAttribute *)0x0;
      do {
        if (-1 < (char)bVar2) {
          iVar3 = isalpha((uint)bVar2);
          if (iVar3 == 0) {
            if (bVar2 < 0x3e) {
              if (bVar2 != 0x3a) {
                if ((bVar2 == 0x2f) && (p_00[1] == 0x3e)) {
                  this->_closingType = CLOSED;
                  return (char *)(p_00 + 2);
                }
LAB_0021cf9d:
                XMLDocument::SetError
                          ((this->super_XMLNode)._document,XML_ERROR_PARSING_ELEMENT,
                           (this->super_XMLNode)._parseLineNum,(char *)0x0);
                return (char *)0x0;
              }
            }
            else if (bVar2 != 0x5f) {
              if (bVar2 == 0x3e) {
                return (char *)(p_00 + 1);
              }
              goto LAB_0021cf9d;
            }
          }
        }
        this_00 = (XMLAttribute *)
                  MemPoolT<80>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
        this_00->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_0027bbb0;
        (this_00->_name)._flags = 0;
        (this_00->_name)._start = (char *)0x0;
        (this_00->_name)._end = (char *)0x0;
        (this_00->_value)._flags = 0;
        (this_00->_value)._start = (char *)0x0;
        (this_00->_value)._end = (char *)0x0;
        this_00->_parseLineNum = 0;
        this_00->_next = (XMLAttribute *)0x0;
        this_00->_memPool = (MemPool *)0x0;
        pXVar9 = (this->super_XMLNode)._document;
        this_00->_memPool = &(pXVar9->_attributePool).super_MemPool;
        (*(pXVar9->_attributePool).super_MemPool._vptr_MemPool[5])();
        pXVar9 = (this->super_XMLNode)._document;
        iVar3 = pXVar9->_parseCurLineNum;
        this_00->_parseLineNum = iVar3;
        pcVar5 = XMLAttribute::ParseDeep
                           (this_00,(char *)p_00,pXVar9->_processEntities,curLineNumPtr);
        if (pcVar5 == (char *)0x0) {
LAB_0021ceea:
          pMVar1 = this_00->_memPool;
          (**this_00->_vptr_XMLAttribute)(this_00);
          (*pMVar1->_vptr_MemPool[4])(pMVar1,this_00);
          pXVar9 = (this->super_XMLNode)._document;
          iVar4 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
          if (CONCAT44(extraout_var_00,iVar4) == 0) {
            pcVar5 = StrPair::GetStr(&(this->super_XMLNode)._value);
          }
          else {
            pcVar5 = (char *)0x0;
          }
          error = XML_ERROR_PARSING_ATTRIBUTE;
          goto LAB_0021cf5f;
        }
        pcVar6 = StrPair::GetStr(&this_00->_name);
        pXVar7 = FindAttribute(this,pcVar6);
        if ((pXVar7 != (XMLAttribute *)0x0) &&
           (pcVar6 = StrPair::GetStr(&pXVar7->_value), pcVar6 != (char *)0x0)) goto LAB_0021ceea;
        ppXVar8 = &pXVar10->_next;
        if (pXVar10 == (XMLAttribute *)0x0) {
          ppXVar8 = &this->_rootAttribute;
        }
        *ppXVar8 = this_00;
        p_00 = (byte *)XMLUtil::SkipWhiteSpace(pcVar5,curLineNumPtr);
        bVar2 = *p_00;
        pXVar10 = this_00;
      } while (bVar2 != 0);
    }
    pXVar9 = (this->super_XMLNode)._document;
    iVar3 = (this->super_XMLNode)._parseLineNum;
    iVar4 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
    if (CONCAT44(extraout_var,iVar4) == 0) {
      pcVar5 = StrPair::GetStr(&(this->super_XMLNode)._value);
    }
    else {
      pcVar5 = (char *)0x0;
    }
    error = XML_ERROR_PARSING_ELEMENT;
LAB_0021cf5f:
    XMLDocument::SetError(pXVar9,error,iVar3,"XMLElement name=%s",pcVar5);
  }
  return (char *)0x0;
}

Assistant:

char* XMLElement::ParseAttributes( char* p, int* curLineNumPtr )
{
    XMLAttribute* prevAttribute = 0;

    // Read the attributes.
    while( p ) {
        p = XMLUtil::SkipWhiteSpace( p, curLineNumPtr );
        if ( !(*p) ) {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, _parseLineNum, "XMLElement name=%s", Name() );
            return 0;
        }

        // attribute.
        if (XMLUtil::IsNameStartChar( *p ) ) {
            XMLAttribute* attrib = CreateAttribute();
            TIXMLASSERT( attrib );
            attrib->_parseLineNum = _document->_parseCurLineNum;

            const int attrLineNum = attrib->_parseLineNum;

            p = attrib->ParseDeep( p, _document->ProcessEntities(), curLineNumPtr );
            if ( !p || Attribute( attrib->Name() ) ) {
                DeleteAttribute( attrib );
                _document->SetError( XML_ERROR_PARSING_ATTRIBUTE, attrLineNum, "XMLElement name=%s", Name() );
                return 0;
            }
            // There is a minor bug here: if the attribute in the source xml
            // document is duplicated, it will not be detected and the
            // attribute will be doubly added. However, tracking the 'prevAttribute'
            // avoids re-scanning the attribute list. Preferring performance for
            // now, may reconsider in the future.
            if ( prevAttribute ) {
                TIXMLASSERT( prevAttribute->_next == 0 );
                prevAttribute->_next = attrib;
            }
            else {
                TIXMLASSERT( _rootAttribute == 0 );
                _rootAttribute = attrib;
            }
            prevAttribute = attrib;
        }
        // end of the tag
        else if ( *p == '>' ) {
            ++p;
            break;
        }
        // end of the tag
        else if ( *p == '/' && *(p+1) == '>' ) {
            _closingType = CLOSED;
            return p+2;	// done; sealed element.
        }
        else {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, _parseLineNum, 0 );
            return 0;
        }
    }
    return p;
}